

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O3

QAbstractItemModel * __thiscall
tst_SerialiserCommon::createComplexModel
          (tst_SerialiserCommon *this,bool tree,bool multiRoles,QObject *parent)

{
  int iVar1;
  QStandardItemModel *this_00;
  ulong uVar2;
  QArrayData *local_80;
  char16_t *local_78;
  undefined8 local_70;
  QString local_68;
  anon_union_24_3_e3d07ef4_for_data local_50;
  
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,parent);
  local_50._forAlignment = -NAN;
  local_50._8_8_ = 0;
  local_50._16_8_ = 0;
  insertBranch(this,(QAbstractItemModel *)this_00,(QModelIndex *)&local_50,multiRoles,(uint)tree * 2
              );
  local_50._forAlignment = -NAN;
  local_50._8_8_ = 0;
  local_50._16_8_ = 0;
  iVar1 = (**(code **)(*(long *)this_00 + 0x78))(this_00,&local_50);
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      local_80 = (QArrayData *)0x0;
      local_78 = L"Row %1";
      local_70 = 6;
      QString::arg((longlong)&local_68,(int)&local_80,(int)uVar2,(QChar)0x0);
      QVariant::QVariant((QVariant *)&local_50,&local_68);
      (**(code **)(*(long *)this_00 + 0xa8))(this_00,uVar2 & 0xffffffff,2,&local_50,2);
      QVariant::~QVariant((QVariant *)&local_50);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_80 != (QArrayData *)0x0) {
        LOCK();
        (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_80,2,8);
        }
      }
      if (multiRoles) {
        QVariant::QVariant((QVariant *)&local_50,(int)uVar2);
        (**(code **)(*(long *)this_00 + 0xa8))(this_00,uVar2 & 0xffffffff,2,&local_50,0x100);
        QVariant::~QVariant((QVariant *)&local_50);
      }
      uVar2 = uVar2 + 1;
      local_50._forAlignment = -NAN;
      local_50._8_8_ = 0;
      local_50._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this_00 + 0x78))(this_00,&local_50);
    } while ((long)uVar2 < (long)iVar1);
  }
  local_50._forAlignment = -NAN;
  local_50._8_8_ = 0;
  local_50._16_8_ = 0;
  iVar1 = (**(code **)(*(long *)this_00 + 0x80))(this_00);
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      local_80 = (QArrayData *)0x0;
      local_78 = L"Column %1";
      local_70 = 9;
      QString::arg((longlong)&local_68,(int)&local_80,(int)uVar2,(QChar)0x0);
      QVariant::QVariant((QVariant *)&local_50,&local_68);
      (**(code **)(*(long *)this_00 + 0xa8))(this_00,uVar2 & 0xffffffff,1,&local_50,2);
      QVariant::~QVariant((QVariant *)&local_50);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_80 != (QArrayData *)0x0) {
        LOCK();
        (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_80,2,8);
        }
      }
      if (multiRoles) {
        QVariant::QVariant((QVariant *)&local_50,(int)uVar2);
        (**(code **)(*(long *)this_00 + 0xa8))(this_00,uVar2 & 0xffffffff,1,&local_50,0x100);
        QVariant::~QVariant((QVariant *)&local_50);
      }
      uVar2 = uVar2 + 1;
      local_50._forAlignment = -NAN;
      local_50._8_8_ = 0;
      local_50._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this_00 + 0x80))(this_00,&local_50);
    } while ((long)uVar2 < (long)iVar1);
  }
  return (QAbstractItemModel *)this_00;
}

Assistant:

QAbstractItemModel *tst_SerialiserCommon::createComplexModel(bool tree, bool multiRoles, QObject *parent)
{
    ComplexModel *result = new ComplexModel(parent);
    insertBranch(result, QModelIndex(), multiRoles, tree ? 2 : 0);
    for (int i = 0; i < result->rowCount(); ++i) {
        result->setHeaderData(i, Qt::Vertical, QStringLiteral("Row %1").arg(i));
        if (multiRoles)
            result->setHeaderData(i, Qt::Vertical, i, Qt::UserRole);
    }
    for (int i = 0; i < result->columnCount(); ++i) {
        result->setHeaderData(i, Qt::Horizontal, QStringLiteral("Column %1").arg(i));
        if (multiRoles)
            result->setHeaderData(i, Qt::Horizontal, i, Qt::UserRole);
    }
    return result;
}